

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-1123_converter.h
# Opt level: O0

bool date::date_converter<date::rfc1123,_long,_void>::to_parts(time_t timepoint,parts *parts)

{
  week_day wVar1;
  seconds_count sVar2;
  date_time dVar3;
  date local_30;
  undefined2 local_2c;
  second_type local_2a;
  date_time dt;
  seconds_count epoch_offset;
  parts *parts_local;
  time_t timepoint_local;
  
  calendar_helper::date_time::date_time(&dt,0x7b2,'\x01','\x01','\0','\0','\0');
  sVar2 = calendar_helper::to_seconds_count(&dt);
  dVar3 = calendar_helper::from_seconds_count(sVar2 + timepoint);
  local_2a = dVar3.super_time.second;
  local_2c = dVar3.super_time._0_2_;
  local_30.year = dVar3.super_date.year;
  parts->year = local_30.year;
  local_30.month = dVar3.super_date.month;
  parts->month = local_30.month;
  local_30.day = dVar3.super_date.day;
  parts->day = local_30.day;
  local_30 = dVar3.super_date;
  wVar1 = calendar_helper::day_of_week(&local_30);
  parts->week_day = wVar1;
  parts->hour = (hour_type)local_2c;
  parts->minute = local_2c._1_1_;
  parts->second = local_2a;
  parts->offset_in_minutes = 0;
  return true;
}

Assistant:

static bool to_parts(std::time_t timepoint, rfc1123::parts& parts)
    {
        using date_time = calendar_helper::date_time;
        const auto epoch_offset = calendar_helper::to_seconds_count(date_time{ 1970, 1, 1, 0, 0, 0 });
        const auto dt = calendar_helper::from_seconds_count(epoch_offset + timepoint);
        parts.year     = dt.year;
        parts.month    = dt.month;
        parts.day      = dt.day;
        parts.week_day = calendar_helper::day_of_week(dt);
        parts.hour     = dt.hour;
        parts.minute   = dt.minute;
        parts.second   = dt.second;
        parts.offset_in_minutes = 0;
        return true;
    }